

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O0

void P_ActivateInStasisCeiling(int tag)

{
  undefined1 local_30 [8];
  TThinkerIterator<DCeiling> iterator;
  DCeiling *scan;
  int tag_local;
  
  TThinkerIterator<DCeiling>::TThinkerIterator((TThinkerIterator<DCeiling> *)local_30,0x80);
  while (iterator.super_FThinkerIterator._16_8_ =
              TThinkerIterator<DCeiling>::Next((TThinkerIterator<DCeiling> *)local_30,false),
        (DCeiling *)iterator.super_FThinkerIterator._16_8_ != (DCeiling *)0x0) {
    if ((((DCeiling *)iterator.super_FThinkerIterator._16_8_)->m_Tag == tag) &&
       (((DCeiling *)iterator.super_FThinkerIterator._16_8_)->m_Direction == 0)) {
      ((DCeiling *)iterator.super_FThinkerIterator._16_8_)->m_Direction =
           ((DCeiling *)iterator.super_FThinkerIterator._16_8_)->m_OldDirection;
      DCeiling::PlayCeilingSound((DCeiling *)iterator.super_FThinkerIterator._16_8_);
    }
  }
  return;
}

Assistant:

void P_ActivateInStasisCeiling (int tag)
{
	DCeiling *scan;
	TThinkerIterator<DCeiling> iterator;

	while ( (scan = iterator.Next ()) )
	{
		if (scan->m_Tag == tag && scan->m_Direction == 0)
		{
			scan->m_Direction = scan->m_OldDirection;
			scan->PlayCeilingSound ();
		}
	}
}